

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar)

{
  char *pcVar1;
  int *piVar2;
  Long LVar3;
  int i;
  int *iptr;
  TagType *cptr;
  int local_24;
  undefined8 in_stack_ffffffffffffffe0;
  BaseFab<char> *in_stack_ffffffffffffffe8;
  
  pcVar1 = BaseFab<char>::dataPtr
                     (in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  piVar2 = Vector<int,_std::allocator<int>_>::dataPtr
                     ((Vector<int,_std::allocator<int>_> *)0x10c0c59);
  local_24 = 0;
  while( true ) {
    LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10c0c7a);
    if (LVar3 <= local_24) break;
    if (*piVar2 != 0) {
      *pcVar1 = (char)*piVar2;
    }
    local_24 = local_24 + 1;
    pcVar1 = pcVar1 + 1;
    piVar2 = piVar2 + 1;
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar) noexcept
{
    BL_ASSERT(ar.size() == domain.numPts());

    TagType*   cptr = dataPtr();
    const int* iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*iptr)
            *cptr = *iptr;
    }
}